

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBatchTestHandler.cxx
# Opt level: O0

void __thiscall cmCTestBatchTestHandler::WriteBatchScript(cmCTestBatchTestHandler *this)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  pointer ppVar3;
  _Self local_270;
  _Self local_268;
  iterator i;
  ofstream fout;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  cmCTestBatchTestHandler *local_10;
  cmCTestBatchTestHandler *this_local;
  
  local_10 = this;
  cmCTest::GetBinaryDir_abi_cxx11_(&local_50,(this->super_cmCTestMultiProcessHandler).CTest);
  std::operator+(&local_30,&local_50,"/Testing/CTestBatch.txt");
  std::__cxx11::string::operator=((string *)&this->Script,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::ofstream::ofstream(&i);
  _Var2 = std::__cxx11::string::c_str();
  std::ofstream::open((char *)&i,_Var2);
  std::operator<<((ostream *)&i,"#!/bin/sh\n");
  local_268._M_node =
       (_Base_ptr)
       std::
       map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ::begin(&(this->super_cmCTestMultiProcessHandler).Tests.
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              );
  while( true ) {
    local_270._M_node =
         (_Base_ptr)
         std::
         map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
         ::end(&(this->super_cmCTestMultiProcessHandler).Tests.
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              );
    bVar1 = std::operator!=(&local_268,&local_270);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
             operator->(&local_268);
    WriteSrunArgs(this,ppVar3->first,(ostream *)&i);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
             operator->(&local_268);
    WriteTestCommand(this,ppVar3->first,(ostream *)&i);
    std::operator<<((ostream *)&i,"\n");
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::operator++
              (&local_268);
  }
  std::ostream::flush();
  std::ofstream::close();
  std::ofstream::~ofstream(&i);
  return;
}

Assistant:

void cmCTestBatchTestHandler::WriteBatchScript()
{
  this->Script = this->CTest->GetBinaryDir() + "/Testing/CTestBatch.txt";
  cmsys::ofstream fout;
  fout.open(this->Script.c_str());
  fout << "#!/bin/sh\n";

  for (TestMap::iterator i = this->Tests.begin(); i != this->Tests.end();
       ++i) {
    this->WriteSrunArgs(i->first, fout);
    this->WriteTestCommand(i->first, fout);
    fout << "\n";
  }
  fout.flush();
  fout.close();
}